

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

iterator * __thiscall
idx2::Insert<unsigned_int,idx2::channel>
          (iterator *__return_storage_ptr__,idx2 *this,hash_table<unsigned_int,_idx2::channel> *Ht,
          uint *Key,channel *Val)

{
  long lVar1;
  bool bVar2;
  ulong local_68;
  i64 H;
  channel *Val_local;
  uint *Key_local;
  hash_table<unsigned_int,_idx2::channel> *Ht_local;
  
  lVar1 = 1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f);
  if (SBORROW8(*(long *)(this + 0x18) * 10,lVar1 * 7) ==
      *(long *)(this + 0x18) * 10 + lVar1 * -7 < 0) {
    IncreaseCapacity<unsigned_int,idx2::channel>((hash_table<unsigned_int,_idx2::channel> *)this);
  }
  local_68 = (ulong)*(uint *)&Ht->Keys * -0x61c8864680b583eb >>
             (0x40U - (char)*(undefined8 *)(this + 0x20) & 0x3f);
  while( true ) {
    bVar2 = false;
    if (*(char *)(*(long *)(this + 0x10) + local_68) == '\x02') {
      bVar2 = *(int *)(*(long *)this + local_68 * 4) != *(int *)&Ht->Keys;
    }
    if (!bVar2) break;
    local_68 = (1L << ((byte)*(undefined8 *)(this + 0x20) & 0x3f)) - 1U & local_68 + 1;
  }
  *(undefined4 *)(*(long *)this + local_68 * 4) = *(undefined4 *)&Ht->Keys;
  memcpy((void *)(*(long *)(this + 8) + local_68 * 0xd8),Key,0xd4);
  if (*(char *)(*(long *)(this + 0x10) + local_68) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + local_68) = 2;
  }
  __return_storage_ptr__->Key = (uint *)(*(long *)this + local_68 * 4);
  __return_storage_ptr__->Val = (channel *)(*(long *)(this + 8) + local_68 * 0xd8);
  __return_storage_ptr__->Ht = (hash_table<unsigned_int,_idx2::channel> *)this;
  __return_storage_ptr__->Idx = local_68;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}